

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O1

int s2pred::TriageCompareEdgeDirections<long_double>
              (Vector3<long_double> *a0,Vector3<long_double> *a1,Vector3<long_double> *b0,
              Vector3<long_double> *b1)

{
  int iVar1;
  longdouble in_ST0;
  longdouble lVar2;
  longdouble lVar3;
  longdouble lVar4;
  longdouble lVar5;
  longdouble lVar6;
  longdouble lVar7;
  longdouble lVar8;
  longdouble lVar9;
  longdouble lVar10;
  longdouble lVar11;
  longdouble lVar12;
  longdouble lVar13;
  longdouble lVar14;
  
  lVar2 = *(longdouble *)a0->c_ - *(longdouble *)a1->c_;
  lVar3 = *(longdouble *)(a0->c_ + 1) - *(longdouble *)(a1->c_ + 1);
  lVar12 = *(longdouble *)a0->c_ + *(longdouble *)a1->c_;
  lVar9 = *(longdouble *)(a0->c_ + 1) + *(longdouble *)(a1->c_ + 1);
  lVar4 = *(longdouble *)(a0->c_ + 2) - *(longdouble *)(a1->c_ + 2);
  lVar14 = *(longdouble *)(a0->c_ + 2) + *(longdouble *)(a1->c_ + 2);
  lVar5 = *(longdouble *)b0->c_ - *(longdouble *)b1->c_;
  lVar13 = *(longdouble *)b1->c_ + *(longdouble *)b0->c_;
  lVar6 = *(longdouble *)(b0->c_ + 1) - *(longdouble *)(b1->c_ + 1);
  lVar10 = *(longdouble *)(b0->c_ + 1) + *(longdouble *)(b1->c_ + 1);
  lVar7 = *(longdouble *)(b0->c_ + 2) - *(longdouble *)(b1->c_ + 2);
  lVar11 = *(longdouble *)(b0->c_ + 2) + *(longdouble *)(b1->c_ + 2);
  lVar8 = in_ST0;
  sqrtl();
  sqrtl();
  lVar2 = (lVar5 * lVar10 - lVar13 * lVar6) * (lVar2 * lVar9 - lVar12 * lVar3) +
          (lVar7 * lVar13 - lVar11 * lVar5) * (lVar4 * lVar12 - lVar14 * lVar2) +
          (longdouble)0 + (lVar6 * lVar11 - lVar10 * lVar7) * (lVar3 * lVar14 - lVar9 * lVar4);
  lVar8 = ((in_ST0 + lVar8) * (longdouble)6.153480596427404e-15 +
          in_ST0 * (longdouble)11.928203230275509 * lVar8) * (longdouble)5.421011e-20;
  iVar1 = 1;
  if (lVar2 <= lVar8) {
    iVar1 = -(uint)(lVar2 < -lVar8);
  }
  return iVar1;
}

Assistant:

int TriageCompareEdgeDirections(
    const Vector3<T>& a0, const Vector3<T>& a1,
    const Vector3<T>& b0, const Vector3<T>& b1) {
  constexpr T T_ERR = rounding_epsilon<T>();
  Vector3<T> na = (a0 - a1).CrossProd(a0 + a1);
  Vector3<T> nb = (b0 - b1).CrossProd(b0 + b1);
  T na_len = na.Norm(), nb_len = nb.Norm();
  T cos_ab = na.DotProd(nb);
  T cos_ab_error = ((5 + 4 * sqrt(3)) * na_len * nb_len +
                    32 * sqrt(3) * DBL_ERR * (na_len + nb_len)) * T_ERR;
  return (cos_ab > cos_ab_error) ? 1 : (cos_ab < -cos_ab_error) ? -1 : 0;
}